

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockTime.h
# Opt level: O1

void __thiscall KDIS::PDU::Stop_Freeze_PDU::SetRealWorldTime(Stop_Freeze_PDU *this,ClockTime *T)

{
  KUINT32 KVar1;
  
  KVar1 = T->m_ui32TimePastHour;
  (this->m_RealWorldTime).m_i32Hour = T->m_i32Hour;
  (this->m_RealWorldTime).m_ui32TimePastHour = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT ClockTime : public DataTypeBase
{
protected:

    KINT32 m_i32Hour;

    KUINT32 m_ui32TimePastHour;

public:

    static const KUINT16 CLOCK_TIME_SIZE = 8;

    ClockTime();

    ClockTime( KINT32 Hour, KUINT32 TimePastHour );

    explicit ClockTime(KDataStream &stream) noexcept(false);

    ~ClockTime() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ClockTime::SetHour
    //              KDIS::DATA_TYPE::ClockTime::GetHour
    // Description: Time.
    // Parameter:   KINT32 H, void
    //************************************
    void SetHour( KINT32 H );
    KINT32 GetHour() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ClockTime::SetTimePastHour
    //              KDIS::DATA_TYPE::ClockTime::GetTimePastHour
    // Description: Time Past Hour. The time past the hour field.
    // Parameter:   KFLOAT32 Z, void
    //************************************
    void SetTimePastHour( KUINT32 TPH );
    KUINT32 GetTimePastHour() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ClockTime::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ClockTime::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::ClockTime::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const ClockTime & Value ) const;
    KBOOL operator != ( const ClockTime & Value ) const;
    KBOOL operator  < ( const ClockTime & Value ) const;
}